

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O3

osfildef * osfoprwt(char *fname,os_filetype_t param_2)

{
  FILE *pFVar1;
  
  pFVar1 = fopen(fname,"r+");
  if (pFVar1 != (FILE *)0x0) {
    return (osfildef *)pFVar1;
  }
  pFVar1 = fopen(fname,"w+");
  return (osfildef *)pFVar1;
}

Assistant:

osfildef*
osfoprwt( const char* fname, os_filetype_t )
{
//  assert(fname != 0);
    // Try opening the file in read/write mode.
    osfildef* fp = fopen(fname, "r+");
    // If opening the file failed, it probably means that it doesn't
    // exist.  In that case, create a new file in read/write mode.
    if (fp == 0) fp = fopen(fname, "w+");
    return fp;
}